

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct64_stage8_sse4_1
               (__m128i *u,__m128i *cospim32,__m128i *cospi32,__m128i *cospim16,__m128i *cospi48,
               __m128i *cospi16,__m128i *cospim48,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rnding,int bit)

{
  __m128i *palVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  __m128i alVar5;
  __m128i alVar6;
  __m128i alVar7;
  __m128i alVar8;
  __m128i alVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  longlong lVar14;
  __m128i *palVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  int iVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar33;
  uint uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  __m128i y;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  alVar2 = u[10];
  alVar3 = u[0xb];
  alVar4 = u[0xc];
  alVar5 = u[0xd];
  auVar27 = pmulld((undefined1  [16])*cospim32,(undefined1  [16])alVar2);
  auVar38 = pmulld((undefined1  [16])alVar5,(undefined1  [16])*cospi32);
  iVar17 = (int)(*rnding)[0];
  iVar19 = *(int *)((long)*rnding + 4);
  iVar21 = (int)(*rnding)[1];
  iVar23 = *(int *)((long)*rnding + 0xc);
  auVar28 = ZEXT416((uint)bit);
  auVar36._0_4_ = (int)alVar5[0] + (int)alVar2[0];
  auVar36._4_4_ = alVar5[0]._4_4_ + alVar2[0]._4_4_;
  auVar36._8_4_ = (int)alVar5[1] + (int)alVar2[1];
  auVar36._12_4_ = alVar5[1]._4_4_ + alVar2[1]._4_4_;
  auVar36 = pmulld(auVar36,(undefined1  [16])*cospi32);
  *(int *)u[0xd] = auVar36._0_4_ + iVar17 >> auVar28;
  *(int *)((long)u[0xd] + 4) = auVar36._4_4_ + iVar19 >> auVar28;
  *(int *)(u[0xd] + 1) = auVar36._8_4_ + iVar21 >> auVar28;
  *(int *)((long)u[0xd] + 0xc) = auVar36._12_4_ + iVar23 >> auVar28;
  *(int *)u[10] = auVar38._0_4_ + auVar27._0_4_ + iVar17 >> auVar28;
  *(int *)((long)u[10] + 4) = auVar38._4_4_ + auVar27._4_4_ + iVar19 >> auVar28;
  *(int *)(u[10] + 1) = auVar38._8_4_ + auVar27._8_4_ + iVar21 >> auVar28;
  *(int *)((long)u[10] + 0xc) = auVar38._12_4_ + auVar27._12_4_ + iVar23 >> auVar28;
  auVar36 = pmulld((undefined1  [16])*cospim32,(undefined1  [16])alVar3);
  auVar38 = pmulld((undefined1  [16])alVar4,(undefined1  [16])*cospi32);
  iVar17 = (int)(*rnding)[0];
  iVar19 = *(int *)((long)*rnding + 4);
  iVar21 = (int)(*rnding)[1];
  iVar23 = *(int *)((long)*rnding + 0xc);
  auVar27._0_4_ = (int)alVar4[0] + (int)alVar3[0];
  auVar27._4_4_ = alVar4[0]._4_4_ + alVar3[0]._4_4_;
  auVar27._8_4_ = (int)alVar4[1] + (int)alVar3[1];
  auVar27._12_4_ = alVar4[1]._4_4_ + alVar3[1]._4_4_;
  auVar27 = pmulld(auVar27,(undefined1  [16])*cospi32);
  *(int *)u[0xc] = auVar27._0_4_ + iVar17 >> auVar28;
  *(int *)((long)u[0xc] + 4) = auVar27._4_4_ + iVar19 >> auVar28;
  *(int *)(u[0xc] + 1) = auVar27._8_4_ + iVar21 >> auVar28;
  *(int *)((long)u[0xc] + 0xc) = auVar27._12_4_ + iVar23 >> auVar28;
  *(int *)u[0xb] = auVar38._0_4_ + auVar36._0_4_ + iVar17 >> auVar28;
  *(int *)((long)u[0xb] + 4) = auVar38._4_4_ + auVar36._4_4_ + iVar19 >> auVar28;
  *(int *)(u[0xb] + 1) = auVar38._8_4_ + auVar36._8_4_ + iVar21 >> auVar28;
  *(int *)((long)u[0xb] + 0xc) = auVar38._12_4_ + auVar36._12_4_ + iVar23 >> auVar28;
  palVar15 = u + 0x10;
  for (uVar16 = 0x10; uVar16 != 0x14; uVar16 = uVar16 + 1) {
    iVar17 = (int)(*palVar15)[0];
    iVar19 = *(int *)((long)*palVar15 + 4);
    iVar21 = (int)(*palVar15)[1];
    iVar23 = *(int *)((long)*palVar15 + 0xc);
    palVar1 = u + (uVar16 ^ 7);
    iVar13 = (int)(*palVar1)[0];
    iVar10 = *(int *)((long)*palVar1 + 4);
    iVar11 = (int)(*palVar1)[1];
    iVar12 = *(int *)((long)*palVar1 + 0xc);
    iVar25 = iVar13 + iVar17;
    iVar29 = iVar10 + iVar19;
    iVar31 = iVar11 + iVar21;
    iVar33 = iVar12 + iVar23;
    iVar17 = iVar17 - iVar13;
    iVar19 = iVar19 - iVar10;
    iVar21 = iVar21 - iVar11;
    iVar23 = iVar23 - iVar12;
    iVar13 = (int)(*clamp_lo)[0];
    iVar10 = *(int *)((long)*clamp_lo + 4);
    iVar11 = (int)(*clamp_lo)[1];
    iVar12 = *(int *)((long)*clamp_lo + 0xc);
    uVar26 = (uint)(iVar25 < iVar13) * iVar13 | (uint)(iVar25 >= iVar13) * iVar25;
    uVar30 = (uint)(iVar29 < iVar10) * iVar10 | (uint)(iVar29 >= iVar10) * iVar29;
    uVar32 = (uint)(iVar31 < iVar11) * iVar11 | (uint)(iVar31 >= iVar11) * iVar31;
    uVar34 = (uint)(iVar33 < iVar12) * iVar12 | (uint)(iVar33 >= iVar12) * iVar33;
    iVar25 = (int)(*clamp_hi)[0];
    iVar29 = *(int *)((long)*clamp_hi + 4);
    iVar31 = (int)(*clamp_hi)[1];
    iVar33 = *(int *)((long)*clamp_hi + 0xc);
    uVar18 = (uint)(iVar17 < iVar13) * iVar13 | (uint)(iVar17 >= iVar13) * iVar17;
    uVar20 = (uint)(iVar19 < iVar10) * iVar10 | (uint)(iVar19 >= iVar10) * iVar19;
    uVar22 = (uint)(iVar21 < iVar11) * iVar11 | (uint)(iVar21 >= iVar11) * iVar21;
    uVar24 = (uint)(iVar23 < iVar12) * iVar12 | (uint)(iVar23 >= iVar12) * iVar23;
    *(uint *)*palVar15 = (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
    *(uint *)((long)*palVar15 + 4) =
         (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
    *(uint *)(*palVar15 + 1) =
         (uint)(iVar31 < (int)uVar32) * iVar31 | (iVar31 >= (int)uVar32) * uVar32;
    *(uint *)((long)*palVar15 + 0xc) =
         (uint)(iVar33 < (int)uVar34) * iVar33 | (iVar33 >= (int)uVar34) * uVar34;
    palVar1 = u + (uVar16 ^ 7);
    *(uint *)*palVar1 = (uint)(iVar25 < (int)uVar18) * iVar25 | (iVar25 >= (int)uVar18) * uVar18;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar29 < (int)uVar20) * iVar29 | (iVar29 >= (int)uVar20) * uVar20;
    *(uint *)(*palVar1 + 1) =
         (uint)(iVar31 < (int)uVar22) * iVar31 | (iVar31 >= (int)uVar22) * uVar22;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar33 < (int)uVar24) * iVar33 | (iVar33 >= (int)uVar24) * uVar24;
    palVar1 = u + (uVar16 ^ 0xf);
    iVar17 = (int)(*palVar1)[0];
    iVar19 = *(int *)((long)*palVar1 + 4);
    iVar21 = (int)(*palVar1)[1];
    iVar23 = *(int *)((long)*palVar1 + 0xc);
    palVar1 = u + (uVar16 ^ 8);
    iVar13 = (int)(*palVar1)[0];
    iVar10 = *(int *)((long)*palVar1 + 4);
    iVar11 = (int)(*palVar1)[1];
    iVar12 = *(int *)((long)*palVar1 + 0xc);
    iVar25 = iVar13 + iVar17;
    iVar29 = iVar10 + iVar19;
    iVar31 = iVar11 + iVar21;
    iVar33 = iVar12 + iVar23;
    iVar17 = iVar17 - iVar13;
    iVar19 = iVar19 - iVar10;
    iVar21 = iVar21 - iVar11;
    iVar23 = iVar23 - iVar12;
    iVar13 = (int)(*clamp_lo)[0];
    iVar10 = *(int *)((long)*clamp_lo + 4);
    iVar11 = (int)(*clamp_lo)[1];
    iVar12 = *(int *)((long)*clamp_lo + 0xc);
    uVar26 = (uint)(iVar25 < iVar13) * iVar13 | (uint)(iVar25 >= iVar13) * iVar25;
    uVar30 = (uint)(iVar29 < iVar10) * iVar10 | (uint)(iVar29 >= iVar10) * iVar29;
    uVar32 = (uint)(iVar31 < iVar11) * iVar11 | (uint)(iVar31 >= iVar11) * iVar31;
    uVar34 = (uint)(iVar33 < iVar12) * iVar12 | (uint)(iVar33 >= iVar12) * iVar33;
    iVar25 = (int)(*clamp_hi)[0];
    iVar29 = *(int *)((long)*clamp_hi + 4);
    iVar31 = (int)(*clamp_hi)[1];
    iVar33 = *(int *)((long)*clamp_hi + 0xc);
    uVar18 = (uint)(iVar17 < iVar13) * iVar13 | (uint)(iVar17 >= iVar13) * iVar17;
    uVar20 = (uint)(iVar19 < iVar10) * iVar10 | (uint)(iVar19 >= iVar10) * iVar19;
    uVar22 = (uint)(iVar21 < iVar11) * iVar11 | (uint)(iVar21 >= iVar11) * iVar21;
    uVar24 = (uint)(iVar23 < iVar12) * iVar12 | (uint)(iVar23 >= iVar12) * iVar23;
    palVar1 = u + (uVar16 ^ 0xf);
    *(uint *)*palVar1 = (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
    *(uint *)(*palVar1 + 1) =
         (uint)(iVar31 < (int)uVar32) * iVar31 | (iVar31 >= (int)uVar32) * uVar32;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar33 < (int)uVar34) * iVar33 | (iVar33 >= (int)uVar34) * uVar34;
    palVar1 = u + (uVar16 ^ 8);
    *(uint *)*palVar1 = (uint)(iVar25 < (int)uVar18) * iVar25 | (iVar25 >= (int)uVar18) * uVar18;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar29 < (int)uVar20) * iVar29 | (iVar29 >= (int)uVar20) * uVar20;
    *(uint *)(*palVar1 + 1) =
         (uint)(iVar31 < (int)uVar22) * iVar31 | (iVar31 >= (int)uVar22) * uVar22;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar33 < (int)uVar24) * iVar33 | (iVar33 >= (int)uVar24) * uVar24;
    palVar15 = palVar15 + 1;
  }
  alVar2 = *cospim16;
  alVar3 = u[0x24];
  alVar4 = u[0x25];
  alVar5 = u[0x26];
  auVar27 = pmulld((undefined1  [16])alVar3,(undefined1  [16])alVar2);
  alVar6 = *cospi48;
  alVar7 = u[0x3b];
  auVar35 = pmulld((undefined1  [16])alVar7,(undefined1  [16])alVar6);
  iVar17 = (int)(*rnding)[0];
  iVar19 = *(int *)((long)*rnding + 4);
  iVar21 = (int)(*rnding)[1];
  iVar23 = *(int *)((long)*rnding + 0xc);
  auVar28 = ZEXT416((uint)bit);
  auVar37 = pmulld((undefined1  [16])alVar4,(undefined1  [16])alVar2);
  alVar8 = u[0x3a];
  auVar39 = pmulld((undefined1  [16])alVar8,(undefined1  [16])alVar6);
  auVar40 = pmulld((undefined1  [16])alVar5,(undefined1  [16])alVar2);
  alVar9 = u[0x39];
  auVar41 = pmulld((undefined1  [16])alVar9,(undefined1  [16])alVar6);
  auVar36 = pmulld((undefined1  [16])alVar2,(undefined1  [16])u[0x27]);
  auVar43 = pmulld((undefined1  [16])u[0x38],(undefined1  [16])alVar6);
  auVar38 = pmulld((undefined1  [16])u[0x27],(undefined1  [16])alVar6);
  auVar42 = pmulld((undefined1  [16])u[0x38],(undefined1  [16])*cospi16);
  *(int *)u[0x38] = auVar38._0_4_ + iVar17 + auVar42._0_4_ >> auVar28;
  *(int *)((long)u[0x38] + 4) = auVar38._4_4_ + iVar19 + auVar42._4_4_ >> auVar28;
  *(int *)(u[0x38] + 1) = auVar38._8_4_ + iVar21 + auVar42._8_4_ >> auVar28;
  *(int *)((long)u[0x38] + 0xc) = auVar38._12_4_ + iVar23 + auVar42._12_4_ >> auVar28;
  auVar38 = pmulld((undefined1  [16])alVar5,(undefined1  [16])*cospi48);
  auVar42 = pmulld((undefined1  [16])alVar9,(undefined1  [16])*cospi16);
  iVar13 = *(int *)((long)*rnding + 4);
  lVar14 = (*rnding)[1];
  iVar10 = *(int *)((long)*rnding + 0xc);
  *(int *)u[0x39] = auVar42._0_4_ + auVar38._0_4_ + (int)(*rnding)[0] >> auVar28;
  *(int *)((long)u[0x39] + 4) = auVar42._4_4_ + auVar38._4_4_ + iVar13 >> auVar28;
  *(int *)(u[0x39] + 1) = auVar42._8_4_ + auVar38._8_4_ + (int)lVar14 >> auVar28;
  *(int *)((long)u[0x39] + 0xc) = auVar42._12_4_ + auVar38._12_4_ + iVar10 >> auVar28;
  auVar38 = pmulld((undefined1  [16])alVar4,(undefined1  [16])*cospi48);
  auVar42 = pmulld((undefined1  [16])alVar8,(undefined1  [16])*cospi16);
  iVar13 = *(int *)((long)*rnding + 4);
  lVar14 = (*rnding)[1];
  iVar10 = *(int *)((long)*rnding + 0xc);
  *(int *)u[0x3a] = auVar42._0_4_ + auVar38._0_4_ + (int)(*rnding)[0] >> auVar28;
  *(int *)((long)u[0x3a] + 4) = auVar42._4_4_ + auVar38._4_4_ + iVar13 >> auVar28;
  *(int *)(u[0x3a] + 1) = auVar42._8_4_ + auVar38._8_4_ + (int)lVar14 >> auVar28;
  *(int *)((long)u[0x3a] + 0xc) = auVar42._12_4_ + auVar38._12_4_ + iVar10 >> auVar28;
  auVar38 = pmulld((undefined1  [16])alVar3,(undefined1  [16])*cospi48);
  auVar42 = pmulld((undefined1  [16])alVar7,(undefined1  [16])*cospi16);
  iVar13 = *(int *)((long)*rnding + 4);
  lVar14 = (*rnding)[1];
  iVar10 = *(int *)((long)*rnding + 0xc);
  *(int *)u[0x3b] = auVar42._0_4_ + auVar38._0_4_ + (int)(*rnding)[0] >> auVar28;
  *(int *)((long)u[0x3b] + 4) = auVar42._4_4_ + auVar38._4_4_ + iVar13 >> auVar28;
  *(int *)(u[0x3b] + 1) = auVar42._8_4_ + auVar38._8_4_ + (int)lVar14 >> auVar28;
  *(int *)((long)u[0x3b] + 0xc) = auVar42._12_4_ + auVar38._12_4_ + iVar10 >> auVar28;
  *(int *)u[0x24] = auVar35._0_4_ + auVar27._0_4_ + iVar17 >> auVar28;
  *(int *)((long)u[0x24] + 4) = auVar35._4_4_ + auVar27._4_4_ + iVar19 >> auVar28;
  *(int *)(u[0x24] + 1) = auVar35._8_4_ + auVar27._8_4_ + iVar21 >> auVar28;
  *(int *)((long)u[0x24] + 0xc) = auVar35._12_4_ + auVar27._12_4_ + iVar23 >> auVar28;
  *(int *)u[0x25] = auVar37._0_4_ + iVar17 + auVar39._0_4_ >> auVar28;
  *(int *)((long)u[0x25] + 4) = auVar37._4_4_ + iVar19 + auVar39._4_4_ >> auVar28;
  *(int *)(u[0x25] + 1) = auVar37._8_4_ + iVar21 + auVar39._8_4_ >> auVar28;
  *(int *)((long)u[0x25] + 0xc) = auVar37._12_4_ + iVar23 + auVar39._12_4_ >> auVar28;
  *(int *)u[0x26] = auVar40._0_4_ + iVar17 + auVar41._0_4_ >> auVar28;
  *(int *)((long)u[0x26] + 4) = auVar40._4_4_ + iVar19 + auVar41._4_4_ >> auVar28;
  *(int *)(u[0x26] + 1) = auVar40._8_4_ + iVar21 + auVar41._8_4_ >> auVar28;
  *(int *)((long)u[0x26] + 0xc) = auVar40._12_4_ + iVar23 + auVar41._12_4_ >> auVar28;
  *(int *)u[0x27] = auVar36._0_4_ + iVar17 + auVar43._0_4_ >> auVar28;
  *(int *)((long)u[0x27] + 4) = auVar36._4_4_ + iVar19 + auVar43._4_4_ >> auVar28;
  *(int *)(u[0x27] + 1) = auVar36._8_4_ + iVar21 + auVar43._8_4_ >> auVar28;
  *(int *)((long)u[0x27] + 0xc) = auVar36._12_4_ + iVar23 + auVar43._12_4_ >> auVar28;
  alVar2 = *cospim48;
  alVar3 = u[0x28];
  alVar4 = u[0x29];
  alVar5 = u[0x2a];
  auVar42 = pmulld((undefined1  [16])alVar3,(undefined1  [16])alVar2);
  alVar6 = *cospim16;
  alVar7 = u[0x37];
  auVar38 = pmulld((undefined1  [16])alVar7,(undefined1  [16])alVar6);
  iVar17 = (int)(*rnding)[0];
  iVar19 = *(int *)((long)*rnding + 4);
  iVar21 = (int)(*rnding)[1];
  iVar23 = *(int *)((long)*rnding + 0xc);
  auVar37 = pmulld((undefined1  [16])alVar4,(undefined1  [16])alVar2);
  alVar8 = u[0x36];
  auVar39 = pmulld((undefined1  [16])alVar8,(undefined1  [16])alVar6);
  auVar40 = pmulld((undefined1  [16])alVar5,(undefined1  [16])alVar2);
  alVar9 = u[0x35];
  auVar41 = pmulld((undefined1  [16])alVar9,(undefined1  [16])alVar6);
  auVar27 = pmulld((undefined1  [16])alVar2,(undefined1  [16])u[0x2b]);
  auVar43 = pmulld((undefined1  [16])u[0x34],(undefined1  [16])alVar6);
  auVar36 = pmulld((undefined1  [16])u[0x2b],(undefined1  [16])alVar6);
  auVar35 = pmulld((undefined1  [16])u[0x34],(undefined1  [16])*cospi48);
  *(int *)u[0x34] = auVar36._0_4_ + iVar17 + auVar35._0_4_ >> auVar28;
  *(int *)((long)u[0x34] + 4) = auVar36._4_4_ + iVar19 + auVar35._4_4_ >> auVar28;
  *(int *)(u[0x34] + 1) = auVar36._8_4_ + iVar21 + auVar35._8_4_ >> auVar28;
  *(int *)((long)u[0x34] + 0xc) = auVar36._12_4_ + iVar23 + auVar35._12_4_ >> auVar28;
  auVar36 = pmulld((undefined1  [16])alVar5,(undefined1  [16])*cospim16);
  auVar35 = pmulld((undefined1  [16])alVar9,(undefined1  [16])*cospi48);
  iVar13 = *(int *)((long)*rnding + 4);
  lVar14 = (*rnding)[1];
  iVar10 = *(int *)((long)*rnding + 0xc);
  *(int *)u[0x35] = auVar35._0_4_ + auVar36._0_4_ + (int)(*rnding)[0] >> auVar28;
  *(int *)((long)u[0x35] + 4) = auVar35._4_4_ + auVar36._4_4_ + iVar13 >> auVar28;
  *(int *)(u[0x35] + 1) = auVar35._8_4_ + auVar36._8_4_ + (int)lVar14 >> auVar28;
  *(int *)((long)u[0x35] + 0xc) = auVar35._12_4_ + auVar36._12_4_ + iVar10 >> auVar28;
  auVar36 = pmulld((undefined1  [16])alVar4,(undefined1  [16])*cospim16);
  auVar35 = pmulld((undefined1  [16])alVar8,(undefined1  [16])*cospi48);
  iVar13 = *(int *)((long)*rnding + 4);
  lVar14 = (*rnding)[1];
  iVar10 = *(int *)((long)*rnding + 0xc);
  *(int *)u[0x36] = auVar35._0_4_ + auVar36._0_4_ + (int)(*rnding)[0] >> auVar28;
  *(int *)((long)u[0x36] + 4) = auVar35._4_4_ + auVar36._4_4_ + iVar13 >> auVar28;
  *(int *)(u[0x36] + 1) = auVar35._8_4_ + auVar36._8_4_ + (int)lVar14 >> auVar28;
  *(int *)((long)u[0x36] + 0xc) = auVar35._12_4_ + auVar36._12_4_ + iVar10 >> auVar28;
  auVar36 = pmulld((undefined1  [16])alVar3,(undefined1  [16])*cospim16);
  auVar35 = pmulld((undefined1  [16])alVar7,(undefined1  [16])*cospi48);
  iVar13 = *(int *)((long)*rnding + 4);
  lVar14 = (*rnding)[1];
  iVar10 = *(int *)((long)*rnding + 0xc);
  *(int *)u[0x37] = auVar35._0_4_ + auVar36._0_4_ + (int)(*rnding)[0] >> auVar28;
  *(int *)((long)u[0x37] + 4) = auVar35._4_4_ + auVar36._4_4_ + iVar13 >> auVar28;
  *(int *)(u[0x37] + 1) = auVar35._8_4_ + auVar36._8_4_ + (int)lVar14 >> auVar28;
  *(int *)((long)u[0x37] + 0xc) = auVar35._12_4_ + auVar36._12_4_ + iVar10 >> auVar28;
  *(int *)u[0x28] = auVar38._0_4_ + auVar42._0_4_ + iVar17 >> auVar28;
  *(int *)((long)u[0x28] + 4) = auVar38._4_4_ + auVar42._4_4_ + iVar19 >> auVar28;
  *(int *)(u[0x28] + 1) = auVar38._8_4_ + auVar42._8_4_ + iVar21 >> auVar28;
  *(int *)((long)u[0x28] + 0xc) = auVar38._12_4_ + auVar42._12_4_ + iVar23 >> auVar28;
  *(int *)u[0x29] = auVar37._0_4_ + iVar17 + auVar39._0_4_ >> auVar28;
  *(int *)((long)u[0x29] + 4) = auVar37._4_4_ + iVar19 + auVar39._4_4_ >> auVar28;
  *(int *)(u[0x29] + 1) = auVar37._8_4_ + iVar21 + auVar39._8_4_ >> auVar28;
  *(int *)((long)u[0x29] + 0xc) = auVar37._12_4_ + iVar23 + auVar39._12_4_ >> auVar28;
  *(int *)u[0x2a] = auVar40._0_4_ + iVar17 + auVar41._0_4_ >> auVar28;
  *(int *)((long)u[0x2a] + 4) = auVar40._4_4_ + iVar19 + auVar41._4_4_ >> auVar28;
  *(int *)(u[0x2a] + 1) = auVar40._8_4_ + iVar21 + auVar41._8_4_ >> auVar28;
  *(int *)((long)u[0x2a] + 0xc) = auVar40._12_4_ + iVar23 + auVar41._12_4_ >> auVar28;
  *(int *)u[0x2b] = auVar27._0_4_ + iVar17 + auVar43._0_4_ >> auVar28;
  *(int *)((long)u[0x2b] + 4) = auVar27._4_4_ + iVar19 + auVar43._4_4_ >> auVar28;
  *(int *)(u[0x2b] + 1) = auVar27._8_4_ + iVar21 + auVar43._8_4_ >> auVar28;
  *(int *)((long)u[0x2b] + 0xc) = auVar27._12_4_ + iVar23 + auVar43._12_4_ >> auVar28;
  return;
}

Assistant:

static inline void idct64_stage8_sse4_1(
    __m128i *u, const __m128i *cospim32, const __m128i *cospi32,
    const __m128i *cospim16, const __m128i *cospi48, const __m128i *cospi16,
    const __m128i *cospim48, const __m128i *clamp_lo, const __m128i *clamp_hi,
    const __m128i *rnding, int bit) {
  int i;
  __m128i temp1, temp2, temp3, temp4;
  temp1 = half_btf_sse4_1(cospim32, &u[10], cospi32, &u[13], rnding, bit);
  u[13] = half_btf_sse4_1(cospi32, &u[10], cospi32, &u[13], rnding, bit);
  u[10] = temp1;
  temp2 = half_btf_sse4_1(cospim32, &u[11], cospi32, &u[12], rnding, bit);
  u[12] = half_btf_sse4_1(cospi32, &u[11], cospi32, &u[12], rnding, bit);
  u[11] = temp2;

  for (i = 16; i < 20; ++i) {
    addsub_sse4_1(u[i], u[i ^ 7], &u[i], &u[i ^ 7], clamp_lo, clamp_hi);
    addsub_sse4_1(u[i ^ 15], u[i ^ 8], &u[i ^ 15], &u[i ^ 8], clamp_lo,
                  clamp_hi);
  }

  temp1 = half_btf_sse4_1(cospim16, &u[36], cospi48, &u[59], rnding, bit);
  temp2 = half_btf_sse4_1(cospim16, &u[37], cospi48, &u[58], rnding, bit);
  temp3 = half_btf_sse4_1(cospim16, &u[38], cospi48, &u[57], rnding, bit);
  temp4 = half_btf_sse4_1(cospim16, &u[39], cospi48, &u[56], rnding, bit);
  u[56] = half_btf_sse4_1(cospi48, &u[39], cospi16, &u[56], rnding, bit);
  u[57] = half_btf_sse4_1(cospi48, &u[38], cospi16, &u[57], rnding, bit);
  u[58] = half_btf_sse4_1(cospi48, &u[37], cospi16, &u[58], rnding, bit);
  u[59] = half_btf_sse4_1(cospi48, &u[36], cospi16, &u[59], rnding, bit);
  u[36] = temp1;
  u[37] = temp2;
  u[38] = temp3;
  u[39] = temp4;

  temp1 = half_btf_sse4_1(cospim48, &u[40], cospim16, &u[55], rnding, bit);
  temp2 = half_btf_sse4_1(cospim48, &u[41], cospim16, &u[54], rnding, bit);
  temp3 = half_btf_sse4_1(cospim48, &u[42], cospim16, &u[53], rnding, bit);
  temp4 = half_btf_sse4_1(cospim48, &u[43], cospim16, &u[52], rnding, bit);
  u[52] = half_btf_sse4_1(cospim16, &u[43], cospi48, &u[52], rnding, bit);
  u[53] = half_btf_sse4_1(cospim16, &u[42], cospi48, &u[53], rnding, bit);
  u[54] = half_btf_sse4_1(cospim16, &u[41], cospi48, &u[54], rnding, bit);
  u[55] = half_btf_sse4_1(cospim16, &u[40], cospi48, &u[55], rnding, bit);
  u[40] = temp1;
  u[41] = temp2;
  u[42] = temp3;
  u[43] = temp4;
}